

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNeuron.cpp
# Opt level: O0

void __thiscall BasicNeuron::BasicNeuron(BasicNeuron *this)

{
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  local_80;
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  local_48;
  BasicNeuron *local_10;
  BasicNeuron *this_local;
  
  local_10 = this;
  INeuron::INeuron(&this->super_INeuron,0.0,0.01,true);
  *(undefined ***)this = &PTR_ProcessInputSpike_0010bcb8;
  memset(&local_48,0,0x38);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::unordered_set(&local_48);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::operator=((unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
               *)&this->field_0x80,&local_48);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::~unordered_set(&local_48);
  memset(&local_80,0,0x38);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::unordered_set(&local_80);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::operator=((unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
               *)&this->field_0x48,&local_80);
  std::
  unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
  ::~unordered_set(&local_80);
  *(undefined4 *)&this->field_0xbc = 0;
  *(undefined4 *)&this->field_0xc4 = 0;
  this->field_0xc8 = 1;
  this->grad = 0.0;
  *(undefined4 *)&this->field_0xcc = 0;
  *(undefined4 *)&this->field_0xd0 = 0;
  return;
}

Assistant:

BasicNeuron::BasicNeuron()
{
    outputSynapses = std::unordered_set<ISynapse *>();
    inputSynapses = std::unordered_set<ISynapse *>();
    potential = 0;
    tRef = 0;
    consistent = true;
    grad = 0;
    inputSpikeCounter = 0;
    outputSpikeCounter = 0;
}